

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optparse.c
# Opt level: O2

void optparse_init(optparse *options,char **argv)

{
  options->argv = argv;
  options->permute = 1;
  options->optind = 1;
  options->subopt = 0;
  options->optarg = (char *)0x0;
  options->errmsg[0] = '\0';
  return;
}

Assistant:

void optparse_init(struct optparse *options, char **argv)
{
    options->argv = argv;
    options->permute = 1;
    options->optind = 1;
    options->subopt = 0;
    options->optarg = 0;
    options->errmsg[0] = '\0';
}